

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

PropertyID lunasvg::csspropertyid(string_view *name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  anon_struct_24_2_b8fd76e8 *paVar2;
  anon_struct_24_2_b8fd76e8 *paVar3;
  anon_struct_24_2_b8fd76e8 *it;
  string_view *name_local;
  
  paVar2 = std::
           end<lunasvg::csspropertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const,35ul>
                     (&csspropertyid::table);
  paVar2 = std::
           lower_bound<lunasvg::csspropertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const*,std::basic_string_view<char,std::char_traits<char>>,lunasvg::csspropertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__1>
                     (csspropertyid::table,paVar2,name);
  paVar3 = std::
           end<lunasvg::csspropertyid(std::basic_string_view<char,std::char_traits<char>>const&)::__0_const,35ul>
                     (&csspropertyid::table);
  if ((paVar2 != paVar3) &&
     (__x._M_len = (paVar2->name)._M_len, __x._M_str = (paVar2->name)._M_str,
     __y._M_len = name->_M_len, __y._M_str = name->_M_str, bVar1 = std::operator!=(__x,__y), !bVar1)
     ) {
    return paVar2->value;
  }
  return Unknown;
}

Assistant:

PropertyID csspropertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"alignment-baseline", PropertyID::Alignment_Baseline},
        {"baseline-shift", PropertyID::Baseline_Shift},
        {"clip-path", PropertyID::Clip_Path},
        {"clip-rule", PropertyID::Clip_Rule},
        {"color", PropertyID::Color},
        {"direction", PropertyID::Direction},
        {"display", PropertyID::Display},
        {"dominant-baseline", PropertyID::Dominant_Baseline},
        {"fill", PropertyID::Fill},
        {"fill-opacity", PropertyID::Fill_Opacity},
        {"fill-rule", PropertyID::Fill_Rule},
        {"font-family", PropertyID::Font_Family},
        {"font-size", PropertyID::Font_Size},
        {"font-style", PropertyID::Font_Style},
        {"font-weight", PropertyID::Font_Weight},
        {"marker-end", PropertyID::Marker_End},
        {"marker-mid", PropertyID::Marker_Mid},
        {"marker-start", PropertyID::Marker_Start},
        {"mask", PropertyID::Mask},
        {"mask-type", PropertyID::Mask_Type},
        {"opacity", PropertyID::Opacity},
        {"overflow", PropertyID::Overflow},
        {"stop-color", PropertyID::Stop_Color},
        {"stop-opacity", PropertyID::Stop_Opacity},
        {"stroke", PropertyID::Stroke},
        {"stroke-dasharray", PropertyID::Stroke_Dasharray},
        {"stroke-dashoffset", PropertyID::Stroke_Dashoffset},
        {"stroke-linecap", PropertyID::Stroke_Linecap},
        {"stroke-linejoin", PropertyID::Stroke_Linejoin},
        {"stroke-miterlimit", PropertyID::Stroke_Miterlimit},
        {"stroke-opacity", PropertyID::Stroke_Opacity},
        {"stroke-width", PropertyID::Stroke_Width},
        {"text-anchor", PropertyID::Text_Anchor},
        {"visibility", PropertyID::Visibility},
        {"white-space", PropertyID::WhiteSpace}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return PropertyID::Unknown;
    return it->value;
}